

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2EntityDecl(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  int local_64;
  int n_content;
  xmlChar *content;
  int n_systemId;
  xmlChar *systemId;
  int n_publicId;
  xmlChar *publicId;
  int n_type;
  int type;
  int n_name;
  xmlChar *name;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
    for (n_type = 0; n_type < 5; n_type = n_type + 1) {
      for (publicId._4_4_ = 0; (int)publicId._4_4_ < 4; publicId._4_4_ = publicId._4_4_ + 1) {
        for (systemId._4_4_ = 0; (int)systemId._4_4_ < 5; systemId._4_4_ = systemId._4_4_ + 1) {
          for (content._4_4_ = 0; (int)content._4_4_ < 5; content._4_4_ = content._4_4_ + 1) {
            for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
              iVar1 = xmlMemBlocks();
              val = gen_void_ptr(name._4_4_,0);
              val_00 = gen_const_xmlChar_ptr(n_type,1);
              iVar2 = gen_int(publicId._4_4_,2);
              val_01 = gen_const_xmlChar_ptr(systemId._4_4_,3);
              val_02 = gen_const_xmlChar_ptr(content._4_4_,4);
              val_03 = gen_xmlChar_ptr(local_64,5);
              xmlSAX2EntityDecl(val,val_00,iVar2,val_01,val_02,val_03);
              call_tests = call_tests + 1;
              des_void_ptr(name._4_4_,val,0);
              des_const_xmlChar_ptr(n_type,val_00,1);
              des_int(publicId._4_4_,iVar2,2);
              des_const_xmlChar_ptr(systemId._4_4_,val_01,3);
              des_const_xmlChar_ptr(content._4_4_,val_02,4);
              des_xmlChar_ptr(local_64,val_03,5);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAX2EntityDecl",(ulong)(uint)(iVar2 - iVar1));
                ctx._4_4_ = ctx._4_4_ + 1;
                printf(" %d",(ulong)name._4_4_);
                printf(" %d",(ulong)(uint)n_type);
                printf(" %d",(ulong)publicId._4_4_);
                printf(" %d",(ulong)systemId._4_4_);
                printf(" %d",(ulong)content._4_4_);
                printf(" %d");
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2EntityDecl(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    const xmlChar * name; /* the entity name */
    int n_name;
    int type; /* the entity type */
    int n_type;
    const xmlChar * publicId; /* The public ID of the entity */
    int n_publicId;
    const xmlChar * systemId; /* The system ID of the entity */
    int n_systemId;
    xmlChar * content; /* the entity value (without processing). */
    int n_content;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_type = 0;n_type < gen_nb_int;n_type++) {
    for (n_publicId = 0;n_publicId < gen_nb_const_xmlChar_ptr;n_publicId++) {
    for (n_systemId = 0;n_systemId < gen_nb_const_xmlChar_ptr;n_systemId++) {
    for (n_content = 0;n_content < gen_nb_xmlChar_ptr;n_content++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        type = gen_int(n_type, 2);
        publicId = gen_const_xmlChar_ptr(n_publicId, 3);
        systemId = gen_const_xmlChar_ptr(n_systemId, 4);
        content = gen_xmlChar_ptr(n_content, 5);

        xmlSAX2EntityDecl(ctx, name, type, publicId, systemId, content);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_int(n_type, type, 2);
        des_const_xmlChar_ptr(n_publicId, publicId, 3);
        des_const_xmlChar_ptr(n_systemId, systemId, 4);
        des_xmlChar_ptr(n_content, content, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2EntityDecl",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_name);
            printf(" %d", n_type);
            printf(" %d", n_publicId);
            printf(" %d", n_systemId);
            printf(" %d", n_content);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}